

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::TeamCityReporter::testRunEnded(TeamCityReporter *this,TestRunStats *runStats)

{
  ostream *poVar1;
  size_type in_RCX;
  StringRef str;
  string local_30;
  
  poVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"##teamcity[testSuiteFinished name=\'",0x23);
  str.m_size = in_RCX;
  str.m_start = (char *)(runStats->runInfo).name.m_size;
  (anonymous_namespace)::escape_abi_cxx11_
            (&local_30,(_anonymous_namespace_ *)(runStats->runInfo).name.m_start,str);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\']\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TeamCityReporter::testRunEnded( TestRunStats const& runStats ) {
        m_stream << "##teamcity[testSuiteFinished name='"
               << escape( runStats.runInfo.name ) << "']\n";
    }